

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__psd_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = stbi__get16be(s);
  uVar2 = stbi__get16be(s);
  if (((uVar2 | iVar1 << 0x10) != 0x38425053) || (iVar1 = stbi__get16be(s), iVar1 != 1))
  goto LAB_00132498;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00132412:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar1) goto LAB_00132412;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar1);
  }
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0x11) {
    iVar1 = stbi__get16be(s);
    uVar2 = stbi__get16be(s);
    if (y != (int *)0x0) {
      *y = iVar1 << 0x10 | uVar2;
    }
    iVar1 = stbi__get16be(s);
    uVar2 = stbi__get16be(s);
    if (x != (int *)0x0) {
      *x = iVar1 << 0x10 | uVar2;
    }
    iVar1 = stbi__get16be(s);
    if (((iVar1 == 8) || (iVar1 == 0x10)) && (iVar1 = stbi__get16be(s), iVar1 == 3)) {
      if (comp == (int *)0x0) {
        return 1;
      }
      *comp = 4;
      return 1;
    }
  }
LAB_00132498:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__psd_info(stbi__context *s, int *x, int *y, int *comp)
{
   int channelCount, dummy, depth;
   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   *y = stbi__get32be(s);
   *x = stbi__get32be(s);
   depth = stbi__get16be(s);
   if (depth != 8 && depth != 16) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 3) {
       stbi__rewind( s );
       return 0;
   }
   *comp = 4;
   return 1;
}